

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv,char **envp)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  string ENV;
  string ARCH;
  string OS;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_50.field_2._M_local_buf[0] = '\0';
  if (isWindows) {
    getenv("OS");
    std::__cxx11::string::assign((char *)&local_30);
    getenv("PROCESSOR_ARCHITECTURE");
    std::__cxx11::string::assign((char *)&local_50);
    std::operator+(&local_90,&local_30,&local_50);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    goto LAB_0010246f;
  }
  pcVar3 = getenv("OSTYPE");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar3,&local_91);
  iVar2 = std::__cxx11::string::compare((char *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (iVar2 == 0) {
LAB_00102443:
    getenv("MACHTYPE");
    std::__cxx11::string::assign((char *)&local_70);
  }
  else {
    pcVar3 = getenv("TERM_PROGRAM");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar3,&local_91);
    iVar2 = std::__cxx11::string::compare((char *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (iVar2 != 0) {
      pcVar3 = getenv("OSTYPE");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar3,&local_91);
      iVar2 = std::__cxx11::string::compare((char *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (iVar2 == 0) goto LAB_00102443;
    }
    std::__cxx11::string::assign((char *)&local_70);
  }
LAB_0010246f:
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "\nNew Language Features & Language Changes in C++17 (http://bit.ly/Cplusplus17Ft) ~ Adrian D."
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Enter \'exit\' at anytime to terminate the application.");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Env. ");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar4);
  do {
    bVar1 = displayFtTypePrompt();
  } while (!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  return 0;
}

Assistant:

int main (int argc, char* argv[], char* envp[]) {

	//ENV
	string ENV, OS, ARCH;

	//Windows
	if (isWindows) {
		OS = getenv("OS");
		ARCH = getenv("PROCESSOR_ARCHITECTURE");
		ENV = OS + ARCH;
	}
	//Linux
	else if (string(getenv("OSTYPE")).compare("linux") == 0) {
		ENV = getenv("MACHTYPE");
	}
	//Mac
	else if (string(getenv("TERM_PROGRAM")).compare("Apple_Terminal") == 0) {
		ENV = "macOS/Mac OSX, x86-64/x64";
	}
	//BSD
	else if (string(getenv("OSTYPE")).compare("bsd") == 0) {
		ENV = getenv("MACHTYPE");
	}
	//Unknown
	else
		ENV = "Unknown";

	//Prompt
	cout << "\nNew Language Features & Language Changes in C++17 (http://bit.ly/Cplusplus17Ft) ~ Adrian D." << endl;
	cout << "Enter 'exit' at anytime to terminate the application." << endl;
	cout << "Env. " << ENV << endl;
	
	//Display Prompts
	while (true) {
		if (displayFtTypePrompt())
			break;
	}

	return 0;
}